

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall kj::anon_unknown_31::WebSocketPipeImpl::Aborted::close(Aborted *this,int __fd)

{
  char (*in_RCX) [41];
  Array<char> AStack_188;
  Exception local_170;
  
  _::Debug::makeDescription<char_const(&)[41]>
            ((String *)&AStack_188,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_170,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xbe5,(String *)&AStack_188);
  Promise<void>::Promise((Promise<void> *)this,&local_170);
  Exception::~Exception(&local_170);
  Array<char>::~Array(&AStack_188);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }